

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QSocks5RevivedDatagram>::emplace<QSocks5RevivedDatagram_const&>
          (QGenericArrayOps<QSocks5RevivedDatagram> *this,qsizetype i,QSocks5RevivedDatagram *args)

{
  QSocks5RevivedDatagram **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  QSocks5RevivedDatagram *pQVar5;
  Data *pDVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long in_FS_OFFSET;
  bool bVar11;
  QSocks5RevivedDatagram tmp;
  Inserter local_a8;
  undefined1 local_58 [40];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QArrayDataPointer<QSocks5RevivedDatagram>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_00241add:
    local_58._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = (args->data).d.d;
    local_58._8_8_ = (args->data).d.ptr;
    local_58._16_8_ = (args->data).d.size;
    if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((QArrayData *)local_58._0_8_)->ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((QArrayData *)local_58._0_8_)->ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QHostAddress::QHostAddress((QHostAddress *)(local_58 + 0x18),&args->address);
    local_58._32_2_ = args->port;
    bVar11 = (this->super_QArrayDataPointer<QSocks5RevivedDatagram>).size != 0;
    QArrayDataPointer<QSocks5RevivedDatagram>::detachAndGrow
              (&this->super_QArrayDataPointer<QSocks5RevivedDatagram>,(uint)(i == 0 && bVar11),1,
               (QSocks5RevivedDatagram **)0x0,(QArrayDataPointer<QSocks5RevivedDatagram> *)0x0);
    uVar10 = local_58._24_8_;
    uVar9 = local_58._16_8_;
    uVar8 = local_58._8_8_;
    uVar7 = local_58._0_8_;
    if (i == 0 && bVar11) {
      pQVar5 = (this->super_QArrayDataPointer<QSocks5RevivedDatagram>).ptr;
      local_58._0_8_ = (QArrayData *)0x0;
      pQVar5[-1].data.d.d = (Data *)uVar7;
      local_58._8_8_ = (char *)0x0;
      pQVar5[-1].data.d.ptr = (char *)uVar8;
      local_58._16_8_ = 0;
      pQVar5[-1].data.d.size = uVar9;
      local_58._24_8_ = (totally_ordered_wrapper<QHostAddressPrivate_*>)0x0;
      pQVar5[-1].address.d.d.ptr = (QHostAddressPrivate *)uVar10;
      pQVar5[-1].port = local_58._32_2_;
      ppQVar1 = &(this->super_QArrayDataPointer<QSocks5RevivedDatagram>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
      pqVar2 = &(this->super_QArrayDataPointer<QSocks5RevivedDatagram>).size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      local_a8.sourceCopyConstruct = 0;
      local_a8.nSource = 0;
      local_a8.move = 0;
      local_a8.sourceCopyAssign = 0;
      local_a8.end = (QSocks5RevivedDatagram *)0x0;
      local_a8.last = (QSocks5RevivedDatagram *)0x0;
      local_a8.where = (QSocks5RevivedDatagram *)0x0;
      local_a8.begin = (this->super_QArrayDataPointer<QSocks5RevivedDatagram>).ptr;
      local_a8.size = (this->super_QArrayDataPointer<QSocks5RevivedDatagram>).size;
      local_a8.data = &this->super_QArrayDataPointer<QSocks5RevivedDatagram>;
      Inserter::insertOne(&local_a8,i,(QSocks5RevivedDatagram *)local_58);
      (local_a8.data)->ptr = local_a8.begin;
      (local_a8.data)->size = local_a8.size;
    }
    QHostAddress::~QHostAddress((QHostAddress *)(local_58 + 0x18));
    if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_58._0_8_,1,0x10);
      }
    }
  }
  else {
    lVar4 = (this->super_QArrayDataPointer<QSocks5RevivedDatagram>).size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc - lVar4 !=
        ((long)((long)(this->super_QArrayDataPointer<QSocks5RevivedDatagram>).ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        -0x3333333333333333)) {
      pQVar5 = (this->super_QArrayDataPointer<QSocks5RevivedDatagram>).ptr + lVar4;
      pDVar6 = (args->data).d.d;
      (pQVar5->data).d.d = pDVar6;
      (pQVar5->data).d.ptr = (args->data).d.ptr;
      (pQVar5->data).d.size = (args->data).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      QHostAddress::QHostAddress(&pQVar5->address,&args->address);
      pQVar5->port = args->port;
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((QSocks5RevivedDatagram *)
          ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QArrayDataPointer<QSocks5RevivedDatagram>).ptr)) goto LAB_00241add;
      pQVar5 = (this->super_QArrayDataPointer<QSocks5RevivedDatagram>).ptr;
      pDVar6 = (args->data).d.d;
      pQVar5[-1].data.d.d = pDVar6;
      pQVar5[-1].data.d.ptr = (args->data).d.ptr;
      pQVar5[-1].data.d.size = (args->data).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      QHostAddress::QHostAddress(&pQVar5[-1].address,&args->address);
      pQVar5[-1].port = args->port;
      ppQVar1 = &(this->super_QArrayDataPointer<QSocks5RevivedDatagram>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QSocks5RevivedDatagram>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }